

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall duckdb::QueryProfiler::QueryTreeToStream(QueryProfiler *this,ostream *ss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  long *plVar6;
  pointer this_00;
  ClientContextState *pCVar7;
  long lVar8;
  undefined8 *puVar9;
  pointer pPVar10;
  type node;
  size_type *psVar11;
  size_type *psVar12;
  char *this_01;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  _Alloc_hider this_02;
  string total_time;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar5 == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_40076f5,0x76);
    ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_4007701,0x76);
    ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_400770d,0x30);
    ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_4007719,0x76);
    ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_4007725,0x76);
    pcVar3 = (this->query_info).query_name._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (this->query_info).query_name._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,anon_var_dwarf_4f47033 + 8,anon_var_dwarf_4f47033 + 9);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," ","");
    StringUtil::Replace(&local_90,&local_50,&local_b0,&local_70);
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_90);
    paVar1 = &local_d0.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar6[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__ostream_insert<char,std::char_traits<char>>
              (ss,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    paVar2 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (((this->query_info).query_name._M_string_length != 0) ||
       ((this->root).
        super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
        super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
        .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl != (ProfilingNode *)0x0)
       ) {
      this_00 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                ::operator->(&this->context->registered_state);
      RegisteredStateManager::States
                ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)&local_d0,
                 this_00);
      sVar4 = local_d0._M_string_length;
      for (this_02._M_p = local_d0._M_dataplus._M_p; this_02._M_p != (pointer)sVar4;
          this_02._M_p = this_02._M_p + 0x10) {
        pCVar7 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                           ((shared_ptr<duckdb::ClientContextState,_true> *)this_02._M_p);
        (**(code **)(*(long *)pCVar7 + 0x78))(pCVar7,ss);
      }
      ::std::
      vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                 *)&local_d0);
      ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_4007641,0x97);
      this_01 = anon_var_dwarf_400767d;
      ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_400767d,0x97);
      if ((this->main_query).finished == true) {
        lVar8 = (this->main_query).end.__d.__r;
      }
      else {
        lVar8 = ::std::chrono::_V2::steady_clock::now();
      }
      RenderTiming_abi_cxx11_
                ((string *)&local_90,(duckdb *)this_01,
                 (double)(lVar8 - (this->main_query).start.__d.__r) / 1000000000.0);
      puVar9 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1e4c0bc);
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = puVar9[3];
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_d0._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      DrawPadded((string *)&local_70,&local_d0,0x2e);
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1e4bd5d);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_b0);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90.field_2._8_8_ = plVar6[3];
        local_90._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_90._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ::std::__ostream_insert<char,std::char_traits<char>>
                (ss,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_40076a1,0x97);
      ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_40076ad,0x97);
      if ((this->root).
          super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
          super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
          .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl !=
          (ProfilingNode *)0x0) {
        if (((this->context->config).profiler_print_format == QUERY_TREE_OPTIMIZER) ||
           ((this->is_explain_analyze == false &&
            ((this->context->config).enable_detailed_profiling == true)))) {
          pPVar10 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                    ::operator->(&this->root);
          PrintPhaseTimingsToStream(ss,&pPVar10->profiling_info,0x32);
        }
        node = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator*(&this->root);
        Render(this,node,ss);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

void QueryProfiler::QueryTreeToStream(std::ostream &ss) const {
	lock_guard<std::mutex> guard(lock);
	ss << "┌─────────────────────────────────────┐\n";
	ss << "│┌───────────────────────────────────┐│\n";
	ss << "││    Query Profiling Information    ││\n";
	ss << "│└───────────────────────────────────┘│\n";
	ss << "└─────────────────────────────────────┘\n";
	ss << StringUtil::Replace(query_info.query_name, "\n", " ") + "\n";

	// checking the tree to ensure the query is really empty
	// the query string is empty when a logical plan is deserialized
	if (query_info.query_name.empty() && !root) {
		return;
	}

	for (auto &state : context.registered_state->States()) {
		state->WriteProfilingInformation(ss);
	}

	constexpr idx_t TOTAL_BOX_WIDTH = 50;
	ss << "┌────────────────────────────────────────────────┐\n";
	ss << "│┌──────────────────────────────────────────────┐│\n";
	string total_time = "Total Time: " + RenderTiming(main_query.Elapsed());
	ss << "││" + DrawPadded(total_time, TOTAL_BOX_WIDTH - 4) + "││\n";
	ss << "│└──────────────────────────────────────────────┘│\n";
	ss << "└────────────────────────────────────────────────┘\n";
	// render the main operator tree
	if (root) {
		// print phase timings
		if (PrintOptimizerOutput()) {
			PrintPhaseTimingsToStream(ss, root->GetProfilingInfo(), TOTAL_BOX_WIDTH);
		}
		Render(*root, ss);
	}
}